

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

bool __thiscall Arbitrarylist::Run(Arbitrarylist *this)

{
  pointer *__return_storage_ptr__;
  size_type sVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  bool local_61;
  undefined1 local_48 [8];
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  vv;
  list<int,_std::allocator<int>_> v;
  Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_> a;
  Arbitrarylist *this_local;
  
  __return_storage_ptr__ =
       &vv.
        super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::generate
            ((output_type *)__return_storage_ptr__,1,0);
  testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::shrink
            ((vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              *)local_48,(output_type *)__return_storage_ptr__);
  sVar1 = std::
          vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
          ::size((vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                  *)local_48);
  local_61 = false;
  if (sVar1 == 2) {
    pvVar2 = std::
             vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                           *)local_48,0);
    sVar1 = std::__cxx11::list<int,_std::allocator<int>_>::size(pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                           *)local_48,1);
    sVar3 = std::__cxx11::list<int,_std::allocator<int>_>::size(pvVar2);
    sVar4 = std::__cxx11::list<int,_std::allocator<int>_>::size
                      ((list<int,_std::allocator<int>_> *)
                       &vv.
                        super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_61 = sVar1 + sVar3 == sVar4;
  }
  std::
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             *)local_48);
  std::__cxx11::list<int,_std::allocator<int>_>::~list
            ((list<int,_std::allocator<int>_> *)
             &vv.
              super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return local_61;
}

Assistant:

DEF_TEST(list, Arbitrary)
{
  testinator::Arbitrary<list<int>> a;
  list<int> v = a.generate(1,0);
  vector<list<int>> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}